

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxapp.h
# Opt level: O0

void __thiscall
ktxApp::ktxApp(ktxApp *this,string *version,string *defaultVersion,commandOptions *options)

{
  initializer_list<argparser::option> __l;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  allocator_type *__a;
  allocator<char> *in_stack_ffffffffffffff20;
  iterator in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  option local_b0;
  option local_90;
  option local_70;
  option local_50;
  undefined1 *local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  *in_RDI = &PTR___cxa_pure_virtual_00147a68;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  in_RDI[5] = local_10;
  in_RDI[6] = local_18;
  in_RDI[7] = local_20;
  __a = (allocator_type *)(in_RDI + 8);
  argparser::option::option((option *)&stack0xffffffffffffff30,"help",no_argument,(int *)0x0,0x68);
  argparser::option::option(&local_b0,"version",no_argument,(int *)0x0,0x76);
  argparser::option::option(&local_90,"test",no_argument,(int *)(in_RDI[7] + 0x38),1);
  argparser::option::option
            (&local_70,"-NSDocumentRevisionsDebugMode",required_argument,(int *)0x0,10000);
  argparser::option::option(&local_50,(char *)0x0,no_argument,(int *)0x0,0);
  local_30 = &stack0xffffffffffffff30;
  local_28 = 5;
  std::allocator<argparser::option>::allocator((allocator<argparser::option> *)0x1076fb);
  __l._M_len = (size_type)in_stack_ffffffffffffff30;
  __l._M_array = in_stack_ffffffffffffff28;
  std::vector<argparser::option,_std::allocator<argparser::option>_>::vector
            ((vector<argparser::option,_std::allocator<argparser::option>_> *)
             in_stack_ffffffffffffff20,__l,__a);
  std::allocator<argparser::option>::~allocator((allocator<argparser::option> *)0x107726);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff22);
  return;
}

Assistant:

ktxApp(std::string& version, std::string& defaultVersion,
           commandOptions& options)
        : version(version), defaultVersion(defaultVersion),
          options(options) { }